

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<kj::StringPtr>::dispose(ArrayBuilder<kj::StringPtr> *this)

{
  StringPtr *firstElement;
  RemoveConst<kj::StringPtr> *pRVar1;
  StringPtr *pSVar2;
  StringPtr *endCopy;
  StringPtr *posCopy;
  StringPtr *ptrCopy;
  ArrayBuilder<kj::StringPtr> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pSVar2 = this->endPtr;
  if (firstElement != (StringPtr *)0x0) {
    this->ptr = (StringPtr *)0x0;
    this->pos = (RemoveConst<kj::StringPtr> *)0x0;
    this->endPtr = (StringPtr *)0x0;
    ArrayDisposer::dispose<kj::StringPtr>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 4,
               (long)pSVar2 - (long)firstElement >> 4);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }